

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_clear(void *handle)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (handle == (void *)0x0) {
    uVar7 = 1;
  }
  else {
    lVar1 = *(long *)((long)handle + 8);
    pvVar2 = (void *)set_remove(*(undefined8 *)(lVar1 + 0x10),(long)handle + 0x18);
    pvVar3 = (void *)set_remove(*(undefined8 *)(lVar1 + 0x18),*(undefined8 *)((long)handle + 0x1018)
                               );
    lVar4 = vector_size(*(undefined8 *)(lVar1 + 0x20));
    if (lVar4 != 0) {
      uVar8 = 0;
      do {
        plVar5 = (long *)vector_at(*(undefined8 *)(lVar1 + 0x20),uVar8);
        if ((void *)*plVar5 == handle) {
          vector_erase(*(undefined8 *)(lVar1 + 0x20),uVar8);
          break;
        }
        uVar8 = uVar8 + 1;
        uVar6 = vector_size(*(undefined8 *)(lVar1 + 0x20));
      } while (uVar8 < uVar6);
    }
    uVar7 = (uint)(pvVar3 != handle || pvVar2 != handle);
    loader_impl_destroy_handle((loader_handle_impl)handle);
  }
  return uVar7;
}

Assistant:

int loader_impl_clear(void *handle)
{
	if (handle != NULL)
	{
		loader_handle_impl handle_impl = handle;

		loader_impl impl = handle_impl->impl;

		size_t iterator;

		/* Remove the handle from the path indexing set */
		int result = !(set_remove(impl->handle_impl_path_map, (set_key)handle_impl->path) == handle_impl);

		/* Remove the handle from the pointer indexing set */
		result |= !(set_remove(impl->handle_impl_map, (set_key)handle_impl->module) == handle_impl);

		/* Search for the handle in the initialization order list and remove it */
		for (iterator = 0; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
		{
			loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

			if (handle_impl == iterator_handle_impl)
			{
				vector_erase(impl->handle_impl_init_order, iterator);
				break;
			}
		}

		loader_impl_destroy_handle(handle_impl);

		return result;
	}

	return 1;
}